

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O0

void __thiscall myvk::FrameManager::recreate_swapchain(FrameManager *this)

{
  element_type *this_00;
  element_type *this_01;
  element_type *this_02;
  GLFWwindow *in_RDI;
  uint32_t i_1;
  shared_ptr<myvk::Fence> *i;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *__range1;
  int height;
  int width;
  GLFWwindow *window;
  int *in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  
  this_00 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x297cf5);
  Swapchain::GetPresentQueuePtr(this_00);
  this_01 = std::__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::PresentQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x297d05);
  PresentQueue::GetSurfacePtr(this_01);
  this_02 = std::__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Surface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x297d15);
  Surface::GetGlfwWindow(this_02);
  glfwGetFramebufferSize
            (in_RDI,(int *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70);
  do {
    glfwGetFramebufferSize
              (in_RDI,(int *)CONCAT17(1,in_stack_ffffffffffffff78),in_stack_ffffffffffffff70);
    glfwWaitEvents();
  } while( true );
}

Assistant:

void FrameManager::recreate_swapchain() {
	GLFWwindow *window = m_swapchain->GetPresentQueuePtr()->GetSurfacePtr()->GetGlfwWindow();
	int width = 0, height = 0;
	glfwGetFramebufferSize(window, &width, &height);
	while (width == 0 || height == 0) {
		glfwGetFramebufferSize(window, &width, &height);
		glfwWaitEvents();
	}

	for (const auto &i : m_frame_fences)
		i->Wait();

	m_swapchain = Swapchain::Create(m_swapchain);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.clear();
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);
}